

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

ssize_t libssh2_channel_write_ex(LIBSSH2_CHANNEL *channel,int stream_id,char *buf,size_t buflen)

{
  int iVar1;
  time_t start_time;
  ssize_t sVar2;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  while( true ) {
    sVar2 = _libssh2_channel_write(channel,stream_id,(uchar *)buf,buflen);
    if (sVar2 != -0x25) {
      return sVar2;
    }
    if (channel->session->api_block_mode == 0) break;
    iVar1 = _libssh2_wait_socket(channel->session,start_time);
    if (iVar1 != 0) {
      return (long)iVar1;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_channel_write_ex(LIBSSH2_CHANNEL *channel, int stream_id,
                         const char *buf, size_t buflen)
{
    ssize_t rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_write(channel, stream_id,
                                        (unsigned char *)buf, buflen));
    return rc;
}